

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestUtility.cpp
# Opt level: O2

void assert::expect_exception(function<void_()> *func,string *msg)

{
  string sStack_38;
  
  std::function<void_()>::operator()(func);
  std::__cxx11::string::string((string *)&sStack_38,(string *)msg);
  is_true(false,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void expect_exception(const std::function<void(void)>& func, std::string msg)
    {
        bool exception_occured = false;

        try
        {
            func();
        }
        catch (...)
        {
            exception_occured = true;
        }

        is_true(exception_occured, msg);
    }